

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.cpp
# Opt level: O0

void testStartWriteUTF8(string *tempdir)

{
  int iVar1;
  undefined8 uVar2;
  ostream *poVar3;
  char *pcVar4;
  exr_result_t _test_rv_12;
  exr_result_t _test_rv_11;
  exr_result_t _test_rv_10;
  exr_result_t _test_rv_9;
  int c;
  uint16_t hval [2];
  exr_result_t _test_rv_8;
  exr_result_t _test_rv_7;
  exr_encode_pipeline_t encoder;
  exr_chunk_info_t cinfo;
  exr_result_t _test_rv_6;
  exr_result_t _test_rv_5;
  exr_result_t _test_rv_4;
  exr_result_t _test_rv_3;
  exr_attr_box2i_t dataW;
  int fh;
  int fw;
  exr_result_t _test_rv_2;
  exr_result_t _test_rv_1;
  exr_result_t _test_rv;
  exr_context_initializer_t cinit;
  int partidx;
  string outfn;
  exr_context_t outf;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffa3c;
  uint in_stack_fffffffffffffa44;
  ostream *in_stack_fffffffffffffa48;
  char *in_stack_fffffffffffffa50;
  char *in_stack_fffffffffffffa60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa68;
  int local_338;
  undefined4 local_334;
  int local_330;
  int local_32c;
  undefined1 local_328 [8];
  long local_320;
  short local_318;
  undefined1 local_128 [64];
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_c8;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  undefined8 local_a8;
  code *pcStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_34;
  string local_30 [32];
  undefined8 local_10 [2];
  
  std::operator+(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  local_58 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0x68;
  pcStack_a0 = err_cb;
  uStack_50 = 0xbf80000000000003;
  local_48 = 8;
  exr_set_default_zip_compression_level(0xffffffff);
  uVar2 = std::__cxx11::string::c_str();
  local_b8 = exr_start_write(local_10,uVar2,0,&local_a8);
  if (local_b8 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_b8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_b8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                   in_stack_fffffffffffffa44,
                   (char *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
  }
  local_bc = exr_add_part(local_10[0],"beauty",0,&local_34);
  if (local_bc != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_bc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_bc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                   in_stack_fffffffffffffa44,
                   (char *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
  }
  if (local_34 != 0) {
    core_test_fail(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                   in_stack_fffffffffffffa44,
                   (char *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
  }
  local_c0 = exr_get_count(local_10[0],&local_34);
  if (local_c0 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c0);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_c0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                   in_stack_fffffffffffffa44,
                   (char *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
  }
  if (local_34 != 1) {
    core_test_fail(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                   in_stack_fffffffffffffa44,
                   (char *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
  }
  local_34 = 0;
  local_c4 = 1;
  local_c8 = 1;
  local_d8 = 0;
  uStack_d0 = 0;
  local_dc = exr_initialize_required_attr_simple(local_10[0],0,1,1,0);
  if (local_dc != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_dc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_dc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                   in_stack_fffffffffffffa44,
                   (char *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
  }
  local_e0 = exr_set_data_window(local_10[0],local_34,&local_d8);
  if (local_e0 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_e0);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_e0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                   in_stack_fffffffffffffa44,
                   (char *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
  }
  uVar5 = 1;
  local_e4 = exr_add_channel(local_10[0],local_34,"h",1,0);
  if (local_e4 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_e4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_e4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                   in_stack_fffffffffffffa44,(char *)CONCAT44(in_stack_fffffffffffffa3c,uVar5));
  }
  local_e8 = exr_write_header(local_10[0]);
  if (local_e8 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_e8);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_e8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                   in_stack_fffffffffffffa44,(char *)CONCAT44(in_stack_fffffffffffffa3c,uVar5));
  }
  local_32c = exr_write_scanline_chunk_info(local_10[0],0,0,local_128);
  if (local_32c != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_32c);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_32c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                   in_stack_fffffffffffffa44,(char *)CONCAT44(in_stack_fffffffffffffa3c,uVar5));
  }
  local_330 = exr_encoding_initialize(local_10[0],0,local_128,local_328);
  if (local_330 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_330);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_330);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                   in_stack_fffffffffffffa44,(char *)CONCAT44(in_stack_fffffffffffffa3c,uVar5));
  }
  local_334 = 0x1234;
  for (local_338 = 0; local_338 < local_318; local_338 = local_338 + 1) {
    *(undefined4 **)(local_320 + (long)local_338 * 0x30 + 0x28) = &local_334;
    *(undefined4 *)(local_320 + (long)local_338 * 0x30 + 0x20) = 2;
    *(undefined4 *)(local_320 + (long)local_338 * 0x30 + 0x24) = 2;
  }
  iVar1 = exr_encoding_choose_default_routines(local_10[0],0,local_328);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                   in_stack_fffffffffffffa44,(char *)CONCAT44(in_stack_fffffffffffffa3c,uVar5));
  }
  iVar1 = exr_encoding_run(local_10[0],0,local_328);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                   in_stack_fffffffffffffa44,(char *)CONCAT44(in_stack_fffffffffffffa3c,uVar5));
  }
  iVar1 = exr_encoding_destroy(local_10[0]);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                   in_stack_fffffffffffffa44,(char *)CONCAT44(in_stack_fffffffffffffa3c,uVar5));
  }
  iVar1 = exr_finish(local_10);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    in_stack_fffffffffffffa50 = (char *)exr_get_default_error_message(iVar1);
    in_stack_fffffffffffffa48 = std::operator<<(poVar3,in_stack_fffffffffffffa50);
    std::ostream::operator<<(in_stack_fffffffffffffa48,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                   in_stack_fffffffffffffa44,(char *)CONCAT44(in_stack_fffffffffffffa3c,uVar5));
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar1 = access(pcVar4,0);
  if (iVar1 == -1) {
    core_test_fail(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                   in_stack_fffffffffffffa44,(char *)CONCAT44(in_stack_fffffffffffffa3c,uVar5));
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  remove(pcVar4);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
testStartWriteUTF8 (const std::string& tempdir)
{
    exr_context_t outf;
    // per google translate, image in Japanese
    std::string   outfn = tempdir + "画像.exr";
    int           partidx;

    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;
    cinit.zip_level = 3;
    cinit.flags |= EXR_CONTEXT_FLAG_WRITE_LEGACY_HEADER;

    exr_set_default_zip_compression_level (-1);

    EXRCORE_TEST_RVAL (exr_start_write (
        &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit));
    EXRCORE_TEST_RVAL (
        exr_add_part (outf, "beauty", EXR_STORAGE_SCANLINE, &partidx));
    EXRCORE_TEST (partidx == 0);
    EXRCORE_TEST_RVAL (exr_get_count (outf, &partidx));
    EXRCORE_TEST (partidx == 1);
    partidx = 0;

    int fw = 1;
    int fh = 1;
    exr_attr_box2i_t dataW = { {0, 0}, {0, 0} };

    EXRCORE_TEST_RVAL (
        exr_initialize_required_attr_simple (outf, partidx, fw, fh, EXR_COMPRESSION_NONE));
    EXRCORE_TEST_RVAL (exr_set_data_window (outf, partidx, &dataW));

    EXRCORE_TEST_RVAL (exr_add_channel (
        outf, partidx, "h", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1));
    EXRCORE_TEST_RVAL (exr_write_header (outf));

    exr_chunk_info_t      cinfo;
    exr_encode_pipeline_t encoder;

    EXRCORE_TEST_RVAL (exr_write_scanline_chunk_info (outf, 0, 0, &cinfo));
    EXRCORE_TEST_RVAL (
        exr_encoding_initialize (outf, 0, &cinfo, &encoder));

    uint16_t hval[] = { 0x1234, 0 };
    for (int c = 0; c < encoder.channel_count; ++c)
    {
        encoder.channels[c].encode_from_ptr   = (const uint8_t *)hval;
        encoder.channels[c].user_pixel_stride = 2;
        encoder.channels[c].user_line_stride  = 2;
    }
    EXRCORE_TEST_RVAL (
        exr_encoding_choose_default_routines (outf, 0, &encoder));
    EXRCORE_TEST_RVAL (exr_encoding_run (outf, 0, &encoder));
    EXRCORE_TEST_RVAL (exr_encoding_destroy (outf, &encoder));

    EXRCORE_TEST_RVAL (exr_finish (&outf));
#ifdef _WIN32
    int      wcSize = 0, fnlen = 0;
    wchar_t* wcFn = NULL;

    fnlen  = (int) strlen (outfn.c_str ());
    wcSize = MultiByteToWideChar (CP_UTF8, 0, outfn.c_str (), fnlen, NULL, 0);
    wcFn   = (wchar_t*) malloc (sizeof (wchar_t) * (wcSize + 1));
    if (wcFn)
    {
        MultiByteToWideChar (CP_UTF8, 0, outfn.c_str (), fnlen, wcFn, wcSize);
        wcFn[wcSize] = 0;
    }
    EXRCORE_TEST ( _waccess (wcFn, 0) != -1 );
    _wremove (wcFn);
    free (wcFn);
#else
    EXRCORE_TEST ( access (outfn.c_str (), F_OK) != -1 );
    remove (outfn.c_str ());
#endif
}